

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O0

void __thiscall
prometheus::detail::MetricsHandler::RemoveCollectable
          (MetricsHandler *this,weak_ptr<prometheus::Collectable> *collectable)

{
  __normal_iterator<std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
  local_80;
  const_iterator local_78;
  shared_ptr<prometheus::Collectable> *local_70;
  weak_ptr<prometheus::Collectable> *local_68;
  __normal_iterator<std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
  local_50;
  __normal_iterator<std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
  local_48;
  const_iterator local_40;
  anon_class_8_1_5fba2448_for__M_pred local_38;
  anon_class_8_1_5fba2448_for__M_pred same_pointer;
  shared_ptr<prometheus::Collectable> locked;
  lock_guard<std::mutex> lock;
  weak_ptr<prometheus::Collectable> *collectable_local;
  MetricsHandler *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)
             &locked.super___shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&this->collectables_mutex_);
  std::weak_ptr<prometheus::Collectable>::lock((weak_ptr<prometheus::Collectable> *)&same_pointer);
  local_38.locked = (shared_ptr<prometheus::Collectable> *)&same_pointer;
  local_50._M_current =
       (weak_ptr<prometheus::Collectable> *)
       std::
       begin<std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>
                 (&this->collectables_);
  local_68 = (weak_ptr<prometheus::Collectable> *)
             std::
             end<std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>
                       (&this->collectables_);
  local_70 = local_38.locked;
  local_48 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::weak_ptr<prometheus::Collectable>*,std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>,prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                       (local_50,(__normal_iterator<std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
                                  )local_68,local_38);
  __gnu_cxx::
  __normal_iterator<std::weak_ptr<prometheus::Collectable>const*,std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>
  ::__normal_iterator<std::weak_ptr<prometheus::Collectable>*>
            ((__normal_iterator<std::weak_ptr<prometheus::Collectable>const*,std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>
              *)&local_40,&local_48);
  local_80._M_current =
       (weak_ptr<prometheus::Collectable> *)
       std::
       end<std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>
                 (&this->collectables_);
  __gnu_cxx::
  __normal_iterator<std::weak_ptr<prometheus::Collectable>const*,std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>
  ::__normal_iterator<std::weak_ptr<prometheus::Collectable>*>
            ((__normal_iterator<std::weak_ptr<prometheus::Collectable>const*,std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>
              *)&local_78,&local_80);
  std::
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  ::erase(&this->collectables_,local_40,local_78);
  std::shared_ptr<prometheus::Collectable>::~shared_ptr
            ((shared_ptr<prometheus::Collectable> *)&same_pointer);
  std::lock_guard<std::mutex>::~lock_guard
            ((lock_guard<std::mutex> *)
             &locked.super___shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void MetricsHandler::RemoveCollectable(
    const std::weak_ptr<Collectable>& collectable) {
  std::lock_guard<std::mutex> lock{collectables_mutex_};

  auto locked = collectable.lock();
  auto same_pointer = [&locked](const std::weak_ptr<Collectable>& candidate) {
    return locked == candidate.lock();
  };

  collectables_.erase(std::remove_if(std::begin(collectables_),
                                     std::end(collectables_), same_pointer),
                      std::end(collectables_));
}